

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readObject(Reader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  bool local_1f2;
  bool local_1ba;
  allocator<char> local_199;
  String local_198;
  bool local_172;
  allocator<char> local_171;
  undefined1 local_170 [6];
  bool finalizeTokenOk;
  undefined1 local_150 [8];
  Token comma;
  Value *pVStack_130;
  bool ok;
  Value *local_128;
  Value *value;
  String local_118;
  undefined1 local_f8 [8];
  Token colon;
  undefined1 local_c0 [8];
  Value numberName;
  bool local_8d;
  bool initialTokenOk;
  undefined1 local_80 [8];
  Value init;
  String name;
  Token tokenName;
  Token *token_local;
  Reader *this_local;
  
  std::__cxx11::string::string((string *)&init.limit_);
  Value::Value((Value *)local_80,objectValue);
  pVVar2 = currentValue(this);
  Value::swapPayload(pVVar2,(Value *)local_80);
  pVVar2 = currentValue(this);
  Value::setOffsetStart(pVVar2,(long)token->start_ - (long)this->begin_);
  do {
    bVar1 = readToken(this,(Token *)((long)&name.field_2 + 8));
    if (!bVar1) {
LAB_00a946c1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"Missing \'}\' or object member name",&local_199);
      this_local._7_1_ =
           addErrorAndRecover(this,&local_198,(Token *)((long)&name.field_2 + 8),tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      numberName.limit_._4_4_ = 1;
      goto LAB_00a9477d;
    }
    local_8d = true;
    while( true ) {
      local_1ba = false;
      if (name.field_2._8_4_ == 0xc) {
        local_1ba = local_8d;
      }
      if (local_1ba == false) break;
      local_8d = readToken(this,(Token *)((long)&name.field_2 + 8));
    }
    if (local_8d == false) goto LAB_00a946c1;
    if ((name.field_2._8_4_ == 2) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this_local._7_1_ = 1;
      numberName.limit_._4_4_ = 1;
      goto LAB_00a9477d;
    }
    std::__cxx11::string::clear();
    if (name.field_2._8_4_ == 5) {
      bVar1 = decodeString(this,(Token *)((long)&name.field_2 + 8),(String *)&init.limit_);
      if (!bVar1) {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
        numberName.limit_._4_4_ = 1;
        goto LAB_00a9477d;
      }
    }
    else {
      if ((name.field_2._8_4_ != 6) || (((this->features_).allowNumericKeys_ & 1U) == 0))
      goto LAB_00a946c1;
      Value::Value((Value *)local_c0,nullValue);
      bVar1 = decodeNumber(this,(Token *)((long)&name.field_2 + 8),(Value *)local_c0);
      if (bVar1) {
        Value::asString_abi_cxx11_((String *)&colon.end_,(Value *)local_c0);
        std::__cxx11::string::operator=((string *)&init.limit_,(string *)&colon.end_);
        std::__cxx11::string::~string((string *)&colon.end_);
      }
      else {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      }
      numberName.limit_._5_3_ = 0;
      numberName.limit_._4_1_ = !bVar1;
      Value::~Value((Value *)local_c0);
      if (numberName.limit_._4_4_ != 0) goto LAB_00a9477d;
    }
    bVar1 = readToken(this,(Token *)local_f8);
    if ((!bVar1) || (local_f8._0_4_ != tokenMemberSeparator)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Missing \':\' after object member name",
                 (allocator<char> *)((long)&value + 7));
      this_local._7_1_ = addErrorAndRecover(this,&local_118,(Token *)local_f8,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
      numberName.limit_._4_4_ = 1;
      goto LAB_00a9477d;
    }
    pVVar2 = currentValue(this);
    pVStack_130 = Value::operator[](pVVar2,(String *)&init.limit_);
    local_128 = pVStack_130;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xfffffffffffffed0);
    comma.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((comma.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      numberName.limit_._4_4_ = 1;
      goto LAB_00a9477d;
    }
    bVar1 = readToken(this,(Token *)local_150);
    if ((!bVar1) ||
       (((local_150._0_4_ != tokenObjectEnd && (local_150._0_4_ != tokenArraySeparator)) &&
        (local_150._0_4_ != tokenComment)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,"Missing \',\' or \'}\' in object declaration",&local_171);
      this_local._7_1_ =
           addErrorAndRecover(this,(String *)local_170,(Token *)local_150,tokenObjectEnd);
      std::__cxx11::string::~string((string *)local_170);
      std::allocator<char>::~allocator(&local_171);
      numberName.limit_._4_4_ = 1;
      goto LAB_00a9477d;
    }
    local_172 = true;
    while( true ) {
      local_1f2 = false;
      if (local_150._0_4_ == tokenComment) {
        local_1f2 = local_172;
      }
      if (local_1f2 == false) break;
      local_172 = readToken(this,(Token *)local_150);
    }
  } while (local_150._0_4_ != tokenObjectEnd);
  this_local._7_1_ = 1;
  numberName.limit_._4_4_ = 1;
LAB_00a9477d:
  Value::~Value((Value *)local_80);
  std::__cxx11::string::~string((string *)&init.limit_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}